

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitStringLiteralExpression
          (SyntaxDumper *this,StringLiteralExpressionSyntax *node)

{
  StringLiteralExpressionSyntax local_50 [56];
  
  traverseExpression(this,(ExpressionSyntax *)node);
  StringLiteralExpressionSyntax::literalToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x30));
  return Skip;
}

Assistant:

virtual Action visitStringLiteralExpression(const StringLiteralExpressionSyntax* node) override
    {
        traverseExpression(node);
        terminal(node->literalToken(), node);
        nonterminal(node->adjacent());
        return Action::Skip;
    }